

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O0

bool vkt::texture::anon_unknown_0::verifierCanBeUsed
               (VkFormat format,FilterMode minFilter,FilterMode magFilter)

{
  bool bVar1;
  TextureChannelClass TVar2;
  TextureFormat TVar3;
  undefined1 local_22;
  undefined1 local_21;
  TextureChannelClass textureChannelClass;
  TextureFormat textureFormat;
  FilterMode magFilter_local;
  FilterMode minFilter_local;
  VkFormat format_local;
  
  TVar3 = ::vk::mapVkFormat(format);
  textureChannelClass = TVar3.type;
  TVar2 = tcu::getTextureChannelClass(textureChannelClass);
  local_21 = false;
  if (((TVar2 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) &&
      (local_21 = false, TVar2 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)) &&
     (local_21 = false, TVar2 != TEXTURECHANNELCLASS_FLOATING_POINT)) {
    bVar1 = tcu::TexVerifierUtil::isLinearFilter(minFilter);
    local_22 = true;
    if (!bVar1) {
      local_22 = tcu::TexVerifierUtil::isLinearFilter(magFilter);
    }
    local_21 = local_22;
  }
  return (bool)((local_21 ^ 0xffU) & 1);
}

Assistant:

bool verifierCanBeUsed(const VkFormat format, const Sampler::FilterMode minFilter, const Sampler::FilterMode magFilter)
{
	const tcu::TextureFormat				textureFormat		= mapVkFormat(format);
	const tcu::TextureChannelClass			textureChannelClass	= tcu::getTextureChannelClass(textureFormat.type);

	return !(!(textureChannelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			   textureChannelClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			   textureChannelClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT) &&
			  (tcu::TexVerifierUtil::isLinearFilter(minFilter) || tcu::TexVerifierUtil::isLinearFilter(magFilter)));
}